

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O0

bool __thiscall Jtag::sendClocks(Jtag *this,unsigned_long cycles)

{
  bool bVar1;
  int iVar2;
  undefined1 local_28 [4];
  FT_STATUS ftStatus;
  DWORD dwNumBytesSent;
  BYTE byOutputBuffer [3];
  unsigned_long cycles_local;
  Jtag *this_local;
  
  _dwNumBytesSent = cycles;
  if (0x10000 < cycles >> 3) {
    bVar1 = sendClocks(this,cycles - 0x80000);
    if (!bVar1) {
      return false;
    }
    _dwNumBytesSent = 0x80000;
  }
  _dwNumBytesSent = _dwNumBytesSent >> 3;
  ftStatus._1_1_ = 0x8f;
  ftStatus._2_1_ = (char)_dwNumBytesSent + -1;
  ftStatus._3_1_ = (undefined1)(_dwNumBytesSent - 1 >> 8);
  iVar2 = FT_Write(this->ftHandle,(long)&ftStatus + 1,3,local_28);
  return iVar2 == 0;
}

Assistant:

bool Jtag::sendClocks(unsigned long cycles) {
	BYTE byOutputBuffer[3];
	DWORD dwNumBytesSent;
	FT_STATUS ftStatus;

	if (cycles / 8 > 65536) {
		if (!sendClocks(cycles - 65536 * 8))
			return false;
		cycles = 65536 * 8;
	}

	cycles /= 8;

	byOutputBuffer[0] = 0x8F;
	byOutputBuffer[1] = (cycles - 1) & 0xff;
	byOutputBuffer[2] = ((cycles - 1) >> 8) & 0xff;
	ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
	if (ftStatus != FT_OK)
		return false;

	return true;
}